

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httprpc.cpp
# Opt level: O0

void JSONErrorReply(HTTPRequest *req,UniValue *objError,JSONRPCRequest *jreq)

{
  string_view key;
  long in_RDX;
  UniValue *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  __sv_type reply;
  int code;
  int nStatus;
  string strReply;
  UniValue *in_stack_fffffffffffffd78;
  UniValue *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  string *hdr;
  int nStatus_00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd98;
  UniValue *in_stack_fffffffffffffda0;
  allocator<char> *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 uVar1;
  allocator<char> local_20a;
  allocator<char> local_209 [29];
  JSONRPCVersion in_stack_fffffffffffffe14;
  optional<UniValue> *in_stack_fffffffffffffe18;
  UniValue *in_stack_fffffffffffffe20;
  UniValue *in_stack_fffffffffffffe28;
  undefined1 local_a0 [88];
  pointer local_8;
  
  local_8 = *(pointer *)(in_FS_OFFSET + 0x28);
  local_209[0x18] = (allocator<char>)(*(int *)(in_RDX + 0x150) != 1);
  inline_assertion_check<false,bool>
            ((bool *)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
             in_stack_fffffffffffffd8c,(char *)in_stack_fffffffffffffd80,
             (char *)in_stack_fffffffffffffd78);
  uVar1 = 500;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
  key._M_str = (char *)in_stack_fffffffffffffdc8;
  key._M_len = (size_t)in_stack_fffffffffffffdc0;
  UniValue::find_value(in_stack_fffffffffffffda0,key);
  UniValue::getInt<int>((UniValue *)CONCAT44(uVar1,in_stack_fffffffffffffdd0));
  UniValue::UniValue(in_RSI,in_stack_fffffffffffffda0);
  UniValue::UniValue((UniValue *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                     in_stack_fffffffffffffd80);
  std::optional<UniValue>::optional
            ((optional<UniValue> *)in_stack_fffffffffffffd78,(optional<UniValue> *)0x151210d);
  JSONRPCReplyObj(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                  in_stack_fffffffffffffe14);
  UniValue::write_abi_cxx11_((UniValue *)&stack0xffffffffffffffb8,(int)local_a0,(void *)0x0,0);
  std::operator+(in_stack_fffffffffffffd90,
                 (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd78);
  UniValue::~UniValue(in_stack_fffffffffffffd78);
  std::optional<UniValue>::~optional((optional<UniValue> *)in_stack_fffffffffffffd78);
  UniValue::~UniValue(in_stack_fffffffffffffd78);
  UniValue::~UniValue(in_stack_fffffffffffffd78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb0);
  hdr = (string *)&local_20a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb0);
  HTTPRequest::WriteHeader
            ((HTTPRequest *)in_RDI,hdr,
             (string *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  nStatus_00 = (int)((ulong)hdr >> 0x20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd78);
  std::allocator<char>::~allocator(&local_20a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd78);
  std::allocator<char>::~allocator(local_209);
  reply = std::__cxx11::string::operator_cast_to_basic_string_view(in_RDI);
  HTTPRequest::WriteReply((HTTPRequest *)in_RDI,nStatus_00,reply);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd78);
  if (*(pointer *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void JSONErrorReply(HTTPRequest* req, UniValue objError, const JSONRPCRequest& jreq)
{
    // Sending HTTP errors is a legacy JSON-RPC behavior.
    Assume(jreq.m_json_version != JSONRPCVersion::V2);

    // Send error reply from json-rpc error object
    int nStatus = HTTP_INTERNAL_SERVER_ERROR;
    int code = objError.find_value("code").getInt<int>();

    if (code == RPC_INVALID_REQUEST)
        nStatus = HTTP_BAD_REQUEST;
    else if (code == RPC_METHOD_NOT_FOUND)
        nStatus = HTTP_NOT_FOUND;

    std::string strReply = JSONRPCReplyObj(NullUniValue, std::move(objError), jreq.id, jreq.m_json_version).write() + "\n";

    req->WriteHeader("Content-Type", "application/json");
    req->WriteReply(nStatus, strReply);
}